

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference ppPVar4;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_328;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_320;
  __normal_iterator<P_*const_*,_std::vector<P_*,_std::allocator<P_*>_>_> local_318;
  const_iterator it;
  vector<P_*,_std::allocator<P_*>_> result;
  string local_2f0 [32];
  undefined1 local_2d0 [8];
  P searchRectMax;
  string local_298 [32];
  undefined1 local_278 [8];
  P searchRectMin;
  undefined1 local_230 [8];
  KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> tree;
  value_type local_210;
  value_type local_208;
  value_type local_200;
  value_type local_1f8;
  undefined1 local_1f0 [8];
  vector<P_*,_std::allocator<P_*>_> values;
  string local_1d0 [32];
  undefined1 local_1b0 [8];
  P p5;
  string local_178 [32];
  undefined1 local_158 [8];
  P p4;
  string local_120 [32];
  undefined1 local_100 [8];
  P p3;
  string local_c8 [32];
  undefined1 local_a8 [8];
  P p2;
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  P p1;
  
  p1._44_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"a",&local_61);
  P::P((P *)local_40,0,2.0,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"b",(allocator *)&p3.field_0x2f);
  P::P((P *)local_a8,1,2.0,(string *)local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&p3.field_0x2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"c",(allocator *)&p4.field_0x2f);
  P::P((P *)local_100,1,2.0,(string *)local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&p4.field_0x2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"d",(allocator *)&p5.field_0x2f);
  P::P((P *)local_158,1,7.0,(string *)local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&p5.field_0x2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,"e",
             (allocator *)
             ((long)&values.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  P::P((P *)local_1b0,1,2.0,(string *)local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&values.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<P_*,_std::allocator<P_*>_>::vector((vector<P_*,_std::allocator<P_*>_> *)local_1f0);
  local_1f8 = (value_type)local_40;
  std::vector<P_*,_std::allocator<P_*>_>::push_back
            ((vector<P_*,_std::allocator<P_*>_> *)local_1f0,&local_1f8);
  local_200 = (value_type)local_a8;
  std::vector<P_*,_std::allocator<P_*>_>::push_back
            ((vector<P_*,_std::allocator<P_*>_> *)local_1f0,&local_200);
  local_208 = (value_type)local_100;
  std::vector<P_*,_std::allocator<P_*>_>::push_back
            ((vector<P_*,_std::allocator<P_*>_> *)local_1f0,&local_208);
  local_210 = (value_type)local_158;
  std::vector<P_*,_std::allocator<P_*>_>::push_back
            ((vector<P_*,_std::allocator<P_*>_> *)local_1f0,&local_210);
  tree.boundingBoxMax = (P *)local_1b0;
  std::vector<P_*,_std::allocator<P_*>_>::push_back
            ((vector<P_*,_std::allocator<P_*>_> *)local_1f0,&tree.boundingBoxMax);
  std::vector<P_*,_std::allocator<P_*>_>::vector
            ((vector<P_*,_std::allocator<P_*>_> *)&searchRectMin.field_0x28,
             (vector<P_*,_std::allocator<P_*>_> *)local_1f0);
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::KDTree
            ((KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_230,
             (vector<P_*,_std::allocator<P_*>_> *)&searchRectMin.field_0x28);
  std::vector<P_*,_std::allocator<P_*>_>::~vector
            ((vector<P_*,_std::allocator<P_*>_> *)&searchRectMin.field_0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"b",(allocator *)&searchRectMax.field_0x2f);
  P::P((P *)local_278,0,0.0,(string *)local_298);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&searchRectMax.field_0x2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2f0,"d",
             (allocator *)
             ((long)&result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  P::P((P *)local_2d0,2,6.0,(string *)local_2f0);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::queryRectangle
            ((vector<P_*,_std::allocator<P_*>_> *)&it,
             (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_230,(P *)local_278,
             (P *)local_2d0);
  poVar2 = std::operator<<((ostream *)&std::cout,"found ");
  sVar3 = std::vector<P_*,_std::allocator<P_*>_>::size((vector<P_*,_std::allocator<P_*>_> *)&it);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," entries:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_320._M_current =
       (P **)std::vector<P_*,_std::allocator<P_*>_>::begin((vector<P_*,_std::allocator<P_*>_> *)&it)
  ;
  __gnu_cxx::__normal_iterator<P*const*,std::vector<P*,std::allocator<P*>>>::__normal_iterator<P**>
            ((__normal_iterator<P*const*,std::vector<P*,std::allocator<P*>>> *)&local_318,&local_320
            );
  while( true ) {
    local_328._M_current =
         (P **)std::vector<P_*,_std::allocator<P_*>_>::end((vector<P_*,_std::allocator<P_*>_> *)&it)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_318,&local_328);
    if (!bVar1) break;
    ppPVar4 = __gnu_cxx::__normal_iterator<P_*const_*,_std::vector<P_*,_std::allocator<P_*>_>_>::
              operator*(&local_318);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(*ppPVar4)->d0);
    poVar2 = std::operator<<(poVar2," ");
    ppPVar4 = __gnu_cxx::__normal_iterator<P_*const_*,_std::vector<P_*,_std::allocator<P_*>_>_>::
              operator*(&local_318);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*ppPVar4)->d1);
    poVar2 = std::operator<<(poVar2," ");
    ppPVar4 = __gnu_cxx::__normal_iterator<P_*const_*,_std::vector<P_*,_std::allocator<P_*>_>_>::
              operator*(&local_318);
    poVar2 = std::operator<<(poVar2,(string *)&(*ppPVar4)->d2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<P_*const_*,_std::vector<P_*,_std::allocator<P_*>_>_>::operator++
              (&local_318);
  }
  p1._44_4_ = 1;
  std::vector<P_*,_std::allocator<P_*>_>::~vector((vector<P_*,_std::allocator<P_*>_> *)&it);
  P::~P((P *)local_2d0);
  P::~P((P *)local_278);
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::~KDTree
            ((KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_230);
  std::vector<P_*,_std::allocator<P_*>_>::~vector((vector<P_*,_std::allocator<P_*>_> *)local_1f0);
  P::~P((P *)local_1b0);
  P::~P((P *)local_158);
  P::~P((P *)local_100);
  P::~P((P *)local_a8);
  P::~P((P *)local_40);
  return p1._44_4_;
}

Assistant:

int main() {
	// prepare elements, three dimensional P objects
	P p1(0, 2, "a");
	P p2(1, 2, "b");
	P p3(1, 2, "c");
	P p4(1, 7, "d");
	P p5(1, 2, "e");

	// prepare the entries
	std::vector<P*> values;
	values.push_back(&p1);
	values.push_back(&p2);
	values.push_back(&p3);
	values.push_back(&p4);
	values.push_back(&p5);

	// the tree uses default implementations of new, delete, set and less for arrays.
	// since we don't use arrays, but the custom type P, we need to pass the functors we defined above to enable the tree to work with P
	kdtree::KDTree<P, dim, P_new, P_delete, P_set, P_less> tree(values);

	// prepare search query.
	// we search for P objects that match these criterias:
	//	d0 >= 0, d0 <= 2
	//	d1 >= 0, d1 <= 6
	//	d2 >= "b", d2 <= "d"
	P searchRectMin(0, 0, "b");
	P searchRectMax(2, 6, "d");

	// perform the search. result will contain the elements that match the query.
	std::vector<P*> result = tree.queryRectangle(&searchRectMin, &searchRectMax);

	// print results
	std::cout << "found " << result.size() << " entries:" << std::endl;
	for (std::vector<P*>::const_iterator it = result.begin(); it != result.end(); ++it) {
		std::cout << (*it)->d0 << " " << (*it)->d1 << " " << (*it)->d2 << std::endl;
	}

	return 1;
}